

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySubImage3D::copyTexSubImage3D
          (TextureCubeMapArraySubImage3D *this,SubImage3DCopyParams *copy_params)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_tex_2d_id,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not attach texture object to framebuffer\'s attachment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x1a0);
  TestCaseBase::checkFramebufferStatus(&this->super_TestCaseBase,0x8ca8);
  (**(code **)(lVar3 + 0x368))
            (0x9009,0,copy_params->m_xoffset,copy_params->m_yoffset,copy_params->m_zoffset,0,0,
             copy_params->m_width,copy_params->m_height);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error filling texture object\'s data store with data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x1a6);
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::copyTexSubImage3D(const SubImage3DCopyParams& copy_params)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_tex_2d_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach texture object to framebuffer's attachment");

	checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	gl.copyTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, copy_params.m_xoffset, copy_params.m_yoffset,
						 copy_params.m_zoffset, 0, 0, copy_params.m_width, copy_params.m_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture object's data store with data");
}